

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O0

uint32_t helper_get_cp_reg_aarch64(CPUARMState_conflict *env,void *rip)

{
  undefined4 local_24;
  uint32_t res;
  ARMCPRegInfo_conflict *ri;
  void *rip_local;
  CPUARMState_conflict *env_local;
  
  if ((*(uint *)((long)rip + 0x14) & 0x40) == 0) {
    local_24 = (**(code **)((long)rip + 0x50))(env,rip);
  }
  else {
    local_24 = (**(code **)((long)rip + 0x50))(env,rip);
  }
  return local_24;
}

Assistant:

uint32_t HELPER(get_cp_reg)(CPUARMState *env, void *rip)
{
    const ARMCPRegInfo *ri = rip;
    uint32_t res;

    if (ri->type & ARM_CP_IO) {
        res = ri->readfn(env, ri);
    } else {
        res = ri->readfn(env, ri);
    }

    return res;
}